

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void frames_write_at(FrameArray *frame_arr,uint32_t index,CallFrame *frame)

{
  uint uVar1;
  uint32_t index_00;
  CallFrame **ppCVar2;
  CallFrame *frame_00;
  undefined1 uVar3;
  ulong uVar4;
  CallFrame **appCStack_48 [2];
  CallFrame **ppCStack_38;
  HTItem **ppHStack_30;
  
  uVar3 = (undefined1)index;
  uVar1 = frame_arr->cap;
  if (index <= uVar1) {
    if (uVar1 == index) {
      uVar4 = 8;
      if (7 < uVar1) {
        uVar4 = (ulong)(uVar1 * 2);
      }
      frame_arr->cap = (uint32_t)uVar4;
      ppCVar2 = (CallFrame **)reallocate(frame_arr->frame_pointers,uVar4 << 3);
      frame_arr->frame_pointers = ppCVar2;
    }
    if (frame_arr->count <= index) {
      frame_arr->count = frame_arr->count + 1;
    }
    frame_arr->frame_pointers[index] = frame;
    return;
  }
  frames_write_at_cold_1();
  *(FrameArray **)(frame_arr + 0x100) = frame_arr;
  frame_arr[0x20f].frame_pointers = (CallFrame **)0x0;
  frame_arr[0x20e].frame_pointers = (CallFrame **)0x0;
  frame_arr[0x20f].count = 0x100000;
  frame_arr[0x20f].cap = 0;
  *(undefined4 *)&frame_arr[0x101].frame_pointers = 0;
  *(undefined1 *)&frame_arr[0x210].count = uVar3;
  *(undefined1 *)((long)&frame_arr[0x210].count + 1) = 0;
  frame_arr[0x210].cap = 0;
  frame_arr[0x100].frame_pointers = (CallFrame **)0x0;
  frame_arr[0x101].count = 0;
  frame_arr[0x101].cap = 0;
  frame_00 = new_call_frame();
  index_00 = *(uint32_t *)&frame_arr[0x101].frame_pointers;
  *(uint32_t *)&frame_arr[0x101].frame_pointers = index_00 + 1;
  frames_write_at((FrameArray *)&frame_arr[0x100].frame_pointers,index_00,frame_00);
  ht_init((HashTable *)appCStack_48,HT_KEY_IDENT_STRING,0x10,free_string_literal);
  frame_arr[0x20d].frame_pointers = ppCStack_38;
  *(HTItem ***)(frame_arr + 0x20e) = ppHStack_30;
  frame_arr[0x20c].frame_pointers = appCStack_48[0];
  *(CallFrame ***)(frame_arr + 0x20d) = appCStack_48[1];
  return;
}

Assistant:

void frames_write_at(FrameArray *frame_arr, uint32_t index, CallFrame *frame) {
    if (index > frame_arr->cap) {
        fprintf(stderr, "Invalid write in frame array");
        exit(100);
    }

    if (index == frame_arr->cap) {
        frame_arr->cap = GROW_CAP(frame_arr->cap);
        frame_arr->frame_pointers = GROW_ARR(frame_arr->frame_pointers, CallFrame *, frame_arr->cap);
    }

    if (index >= frame_arr->count) {
        ++frame_arr->count;
    }

    frame_arr->frame_pointers[index] = frame;
}